

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O2

void __thiscall icu_63::DecimalFormat::setParseIntegerOnly(DecimalFormat *this,UBool value)

{
  if (((this->fields->properties).
       super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr)->parseIntegerOnly
      == (bool)value) {
    return;
  }
  NumberFormat::setParseIntegerOnly(&this->super_NumberFormat,value);
  ((this->fields->properties).super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.
  ptr)->parseIntegerOnly = value != '\0';
  touchNoError(this);
  return;
}

Assistant:

void DecimalFormat::setParseIntegerOnly(UBool value) {
    if (UBOOL_TO_BOOL(value) == fields->properties->parseIntegerOnly) { return; }
    NumberFormat::setParseIntegerOnly(value); // to set field for compatibility
    fields->properties->parseIntegerOnly = value;
    touchNoError();
}